

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncToString(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
               vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  StringLiteral *this;
  ExpressionValueType EVar1;
  pointer pEVar2;
  StringLiteral local_78;
  string local_58;
  string local_38;
  
  this = &__return_storage_ptr__->strValue;
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar2 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar1 = pEVar2->type;
  if (EVar1 == Integer) {
    tinyformat::format<long>(&local_38,"%d",&(pEVar2->field_1).intValue);
    StringLiteral::StringLiteral(&local_78,&local_38);
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._value._M_dataplus._M_p != &local_78._value.field_2) {
      operator_delete(local_78._value._M_dataplus._M_p,
                      local_78._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_0012d5b1;
  }
  else {
    if (EVar1 != Float) {
      if (EVar1 != String) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_assign((string *)this);
      goto LAB_0012d5b1;
    }
    tinyformat::format<double>(&local_58,"%#.17g",&(pEVar2->field_1).floatValue);
    StringLiteral::StringLiteral(&local_78,&local_58);
    std::__cxx11::string::operator=((string *)this,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._value._M_dataplus._M_p != &local_78._value.field_2) {
      operator_delete(local_78._value._M_dataplus._M_p,
                      local_78._value.field_2._M_allocated_capacity + 1);
    }
    local_38.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_0012d5b1;
  }
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
LAB_0012d5b1:
  __return_storage_ptr__->type = String;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncToString(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::String:
		result.strValue = parameters[0].strValue;
		break;
	case ExpressionValueType::Integer:
		result.strValue = tfm::format("%d",parameters[0].intValue);
		break;
	case ExpressionValueType::Float:
		result.strValue = tfm::format("%#.17g",parameters[0].floatValue);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::String;
	return result;
}